

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O1

void __thiscall
toml::detail::location::location
          (location *this,string *source_name,vector<char,_std::allocator<char>_> *cont)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  
  (this->super_region_base)._vptr_region_base = (_func_int **)&PTR__location_001d9db0;
  p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x28);
  p_Var5->_M_use_count = 1;
  p_Var5->_M_weak_count = 1;
  p_Var5->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_001d9eb8;
  p_Var5[1]._vptr__Sp_counted_base =
       (_func_int **)
       (cont->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
       _M_start;
  *(pointer *)&p_Var5[1]._M_use_count =
       (cont->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  p_Var5[2]._vptr__Sp_counted_base =
       (_func_int **)
       (cont->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  (cont->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  (cont->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  (cont->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->source_).
  super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)(p_Var5 + 1);
  (this->source_).
  super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var5;
  this->line_number_ = 1;
  paVar1 = &(this->source_name_).field_2;
  (this->source_name_)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (source_name->_M_dataplus)._M_p;
  paVar2 = &source_name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&source_name->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->source_name_).field_2 + 8) = uVar4;
  }
  else {
    (this->source_name_)._M_dataplus._M_p = pcVar3;
    (this->source_name_).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->source_name_)._M_string_length = source_name->_M_string_length;
  (source_name->_M_dataplus)._M_p = (pointer)paVar2;
  source_name->_M_string_length = 0;
  (source_name->field_2)._M_local_buf[0] = '\0';
  (this->iter_)._M_current =
       (((this->source_).
         super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
       _M_start;
  return;
}

Assistant:

location(std::string source_name, std::vector<char> cont)
      : source_(std::make_shared<std::vector<char>>(std::move(cont))),
        line_number_(1), source_name_(std::move(source_name)), iter_(source_->cbegin())
    {}